

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

void draw_h_arrow(int x1,int y,int x2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = (uint)(x1 <= x2) * 2 + -1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,x1,(ulong)(uint)y,(ulong)(uint)x2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)x2,(ulong)(y - 4),(ulong)(y + 4));
  uVar2 = x2 + iVar3 * -5;
  uVar1 = x2 - iVar3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
            (fl_graphics_driver,(ulong)uVar2,(ulong)(y - 2),(ulong)uVar1,(ulong)(uint)y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
            (fl_graphics_driver,(ulong)uVar2,(ulong)(y + 2),(ulong)uVar1,(ulong)(uint)y);
  return;
}

Assistant:

static void draw_h_arrow(int x1, int y, int x2) {
  int dx = (x1>x2) ? -1 : 1 ;
  fl_xyline(x1, y, x2);
  fl_yxline(x2, y-4, y+4);
  fl_line(x2-dx*5, y-2, x2-dx, y);
  fl_line(x2-dx*5, y+2, x2-dx, y);
}